

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMakeSubDirRegistering.cpp
# Opt level: O2

void __thiscall
proj2cmake::cmake::CMakeSubDirRegistering::operator()(CMakeSubDirRegistering *this,path *subDir)

{
  bool bVar1;
  ostream *poVar2;
  path local_40;
  
  poVar2 = std::operator<<(this->mOs,"add_subdirectory(");
  boost::filesystem::operator<<(poVar2,subDir);
  bVar1 = boost::algorithm::contains<std::__cxx11::string,char[3],boost::algorithm::is_equal>
                    (subDir,"..");
  if (bVar1) {
    poVar2 = std::operator<<(this->mOs," ");
    boost::filesystem::path::filename();
    boost::filesystem::operator<<(poVar2,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar2 = std::operator<<(this->mOs,")");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void cmake::CMakeSubDirRegistering::operator()(const boost::filesystem::path& subDir)
{
   mOs << "add_subdirectory(" << subDir;

   if (boost::contains(subDir.string(), ".."))
   {
      mOs << " " << subDir.filename();
   }

   mOs << ")" << std::endl;
}